

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::BeginTabBarEx(ImGuiTabBar *tab_bar,ImRect *tab_bar_bb,ImGuiTabBarFlags flags)

{
  ImVec2 IVar1;
  uint in_EDX;
  ImVec2 *in_RSI;
  ImGuiTabBar *in_RDI;
  ImGuiPtrOrIndex IVar2;
  float separator_max_x;
  float separator_min_x;
  float y;
  ImU32 col;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiPtrOrIndex *v;
  undefined4 in_stack_ffffffffffffff90;
  ImGuiID in_stack_ffffffffffffff94;
  float in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  ImVec2 local_58;
  void *local_50;
  int local_48;
  void *local_40;
  int local_38;
  ImGuiWindow *local_30;
  ImGuiContext *local_28;
  uint local_1c;
  ImVec2 *local_18;
  ImGuiTabBar *local_10;
  bool local_1;
  
  local_28 = GImGui;
  local_30 = GImGui->CurrentWindow;
  if ((local_30->SkipItems & 1U) == 0) {
    local_1c = in_EDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    if ((in_EDX & 0x100000) == 0) {
      PushOverrideID(in_stack_ffffffffffffff94);
    }
    v = (ImGuiPtrOrIndex *)&local_28->CurrentTabBarStack;
    IVar2 = GetTabBarRefFromTabBar
                      ((ImGuiTabBar *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
    ;
    local_50 = IVar2.Ptr;
    local_48 = IVar2.Index;
    local_40 = local_50;
    local_38 = local_48;
    ImVector<ImGuiPtrOrIndex>::push_back
              ((ImVector<ImGuiPtrOrIndex> *)
               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),v);
    local_28->CurrentTabBar = local_10;
    local_10->BackupCursorPos = (local_30->DC).CursorPos;
    if (local_10->CurrFrameVisible == local_28->FrameCount) {
      ImVec2::ImVec2(&local_58,(local_10->BarRect).Min.x,
                     (local_10->BarRect).Max.y + local_10->ItemSpacingY);
      (local_30->DC).CursorPos = local_58;
      local_10->BeginCount = local_10->BeginCount + '\x01';
      local_1 = true;
    }
    else {
      if ((((local_1c & 1) != (local_10->Flags & 1U)) ||
          (((local_10->TabsAddedNew & 1U) != 0 && ((local_1c & 1) == 0)))) &&
         (1 < (local_10->Tabs).Size)) {
        qsort((local_10->Tabs).Data,(long)(local_10->Tabs).Size,0x24,TabItemComparerByBeginOrder);
      }
      local_10->TabsAddedNew = false;
      if ((local_1c & 0xc0) == 0) {
        local_1c = local_1c | 0x40;
      }
      local_10->Flags = local_1c;
      (local_10->BarRect).Min = *local_18;
      (local_10->BarRect).Max = local_18[1];
      local_10->WantLayout = true;
      local_10->PrevFrameVisible = local_10->CurrFrameVisible;
      local_10->CurrFrameVisible = local_28->FrameCount;
      local_10->PrevTabsContentsHeight = local_10->CurrTabsContentsHeight;
      local_10->CurrTabsContentsHeight = 0.0;
      local_10->ItemSpacingY = (local_28->Style).ItemSpacing.y;
      local_10->FramePadding = (local_28->Style).FramePadding;
      local_10->TabsActiveCount = 0;
      local_10->BeginCount = '\x01';
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa0,(local_10->BarRect).Min.x,
                     (local_10->BarRect).Max.y + local_10->ItemSpacingY);
      IVar1.y = in_stack_ffffffffffffffa4;
      IVar1.x = in_stack_ffffffffffffffa0;
      (local_30->DC).CursorPos = IVar1;
      GetColorU32((ImGuiCol)in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
      local_1 = true;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool    ImGui::BeginTabBarEx(ImGuiTabBar* tab_bar, const ImRect& tab_bar_bb, ImGuiTabBarFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    if ((flags & ImGuiTabBarFlags_DockNode) == 0)
        PushOverrideID(tab_bar->ID);

    // Add to stack
    g.CurrentTabBarStack.push_back(GetTabBarRefFromTabBar(tab_bar));
    g.CurrentTabBar = tab_bar;

    // Append with multiple BeginTabBar()/EndTabBar() pairs.
    tab_bar->BackupCursorPos = window->DC.CursorPos;
    if (tab_bar->CurrFrameVisible == g.FrameCount)
    {
        window->DC.CursorPos = ImVec2(tab_bar->BarRect.Min.x, tab_bar->BarRect.Max.y + tab_bar->ItemSpacingY);
        tab_bar->BeginCount++;
        return true;
    }

    // Ensure correct ordering when toggling ImGuiTabBarFlags_Reorderable flag, or when a new tab was added while being not reorderable
    if ((flags & ImGuiTabBarFlags_Reorderable) != (tab_bar->Flags & ImGuiTabBarFlags_Reorderable) || (tab_bar->TabsAddedNew && !(flags & ImGuiTabBarFlags_Reorderable)))
        if (tab_bar->Tabs.Size > 1)
            ImQsort(tab_bar->Tabs.Data, tab_bar->Tabs.Size, sizeof(ImGuiTabItem), TabItemComparerByBeginOrder);
    tab_bar->TabsAddedNew = false;

    // Flags
    if ((flags & ImGuiTabBarFlags_FittingPolicyMask_) == 0)
        flags |= ImGuiTabBarFlags_FittingPolicyDefault_;

    tab_bar->Flags = flags;
    tab_bar->BarRect = tab_bar_bb;
    tab_bar->WantLayout = true; // Layout will be done on the first call to ItemTab()
    tab_bar->PrevFrameVisible = tab_bar->CurrFrameVisible;
    tab_bar->CurrFrameVisible = g.FrameCount;
    tab_bar->PrevTabsContentsHeight = tab_bar->CurrTabsContentsHeight;
    tab_bar->CurrTabsContentsHeight = 0.0f;
    tab_bar->ItemSpacingY = g.Style.ItemSpacing.y;
    tab_bar->FramePadding = g.Style.FramePadding;
    tab_bar->TabsActiveCount = 0;
    tab_bar->BeginCount = 1;

    // Set cursor pos in a way which only be used in the off-chance the user erroneously submits item before BeginTabItem(): items will overlap
    window->DC.CursorPos = ImVec2(tab_bar->BarRect.Min.x, tab_bar->BarRect.Max.y + tab_bar->ItemSpacingY);

    // Draw separator
    const ImU32 col = GetColorU32((flags & ImGuiTabBarFlags_IsFocused) ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive);
    const float y = tab_bar->BarRect.Max.y - 1.0f;
    {
        const float separator_min_x = tab_bar->BarRect.Min.x - IM_FLOOR(window->WindowPadding.x * 0.5f);
        const float separator_max_x = tab_bar->BarRect.Max.x + IM_FLOOR(window->WindowPadding.x * 0.5f);
        //window->DrawList->AddLine(ImVec2(separator_min_x, y), ImVec2(separator_max_x, y), col, 1.0f);
    }
    return true;
}